

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall UnscentedKalmanFilter::Prediction(UnscentedKalmanFilter *this,double delta_t)

{
  ostream *poVar1;
  MatrixXd Xsig_aug;
  MatrixXd local_38;
  
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_38,&this->n_aug_,&this->n_sigma_);
  if (this->debug_ != 0) {
    std::operator<<((ostream *)&std::cout,"Predict ");
    poVar1 = std::ostream::_M_insert<double>(delta_t);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  GenerateAugmentedSigmaPoints(this,&this->x_,&this->P_,&local_38);
  SigmaPointPrediction(this,delta_t,&local_38,&this->Xsig_pred_);
  PredictMeanAndCovariance(this,&this->Xsig_pred_,&this->x_,&this->P_);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void UnscentedKalmanFilter::Prediction(double delta_t) {

    MatrixXd Xsig_aug(n_aug_, n_sigma_);

    if (debug_)
        std::cout << "Predict " << delta_t << std::endl;
 
    GenerateAugmentedSigmaPoints(x_, P_, Xsig_aug);
    SigmaPointPrediction(delta_t, Xsig_aug, Xsig_pred_);
    PredictMeanAndCovariance(Xsig_pred_, x_, P_);
}